

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O3

void __thiscall ExecutorX86::UpdateFunctionPointer(ExecutorX86 *this,uint source,uint target)

{
  uint uVar1;
  uchar **ppuVar2;
  ExpiredFunctionAddressList *pEVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = (this->functionAddress).count;
  if ((target < uVar1) && (source < uVar1)) {
    ppuVar2 = (this->functionAddress).data;
    ppuVar2[source] = ppuVar2[target];
    uVar4 = (ulong)(this->expiredFunctionAddressLists).count;
    if (uVar4 != 0) {
      lVar5 = 0;
      do {
        pEVar3 = (this->expiredFunctionAddressLists).data;
        if (source < *(uint *)((long)&pEVar3->count + lVar5)) {
          *(uchar **)(*(long *)((long)&pEVar3->data + lVar5) + (ulong)source * 8) =
               (this->functionAddress).data[target];
        }
        lVar5 = lVar5 + 0x10;
      } while (uVar4 << 4 != lVar5);
    }
    return;
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x7f,
                "T &FastVector<unsigned char *>::operator[](unsigned int) [T = unsigned char *, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

void ExecutorX86::UpdateFunctionPointer(unsigned source, unsigned target)
{
	functionAddress[source] = functionAddress[target];

	for(unsigned i = 0; i < expiredFunctionAddressLists.size(); i++)
	{
		ExpiredFunctionAddressList &info = expiredFunctionAddressLists[i];

		if(source < info.count)
			info.data[source] = functionAddress[target];
	}
}